

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O2

vector * __thiscall lsh::table::query(vector *__return_storage_ptr__,table *this,vector *v)

{
  unordered_map<unsigned_int,_lsh::vector,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_lsh::vector>_>_>
  *this_00;
  pointer puVar1;
  vector *pvVar2;
  uint uVar3;
  const_iterator cVar4;
  mapped_type *pmVar5;
  mapped_type *v_00;
  invalid_argument *this_01;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_02;
  ulong uVar6;
  mapped_type *pmVar7;
  uint uVar8;
  pointer puVar9;
  uint u;
  vector *local_80;
  ulong local_78;
  vector *local_70;
  table *local_68;
  ulong local_60;
  vector k;
  
  uVar8 = this->dimensions_;
  local_80 = __return_storage_ptr__;
  local_70 = v;
  uVar3 = lsh::vector::size(v);
  if (uVar8 == uVar3) {
    this_00 = &this->vectors_;
    local_60 = ((long)(this->partitions_).
                      super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->partitions_).
                     super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x38 & 0xffffffff;
    uVar8 = 0xffffffff;
    pmVar7 = (vector *)0x0;
    local_68 = this;
    for (uVar6 = 0; pvVar2 = local_80, uVar6 != local_60; uVar6 = uVar6 + 1) {
      lsh::vector::operator&
                (&k,(this->masks_).super__Vector_base<lsh::vector,_std::allocator<lsh::vector>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar6,local_70);
      this_02 = &(this->partitions_).
                 super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_h;
      local_78 = uVar6;
      u = lsh::vector::hash(&k);
      cVar4 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(this_02,&u);
      if (cVar4.
          super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        u = lsh::vector::hash(&k);
        pmVar5 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)this_02,&u);
        puVar1 = (pmVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar9 = (pmVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start; this = local_68, puVar9 != puVar1;
            puVar9 = puVar9 + 1) {
          u = *puVar9;
          v_00 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_lsh::vector>,_std::allocator<std::pair<const_unsigned_int,_lsh::vector>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_lsh::vector>,_std::allocator<std::pair<const_unsigned_int,_lsh::vector>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)this_00,&u);
          uVar3 = lsh::vector::distance(local_70,v_00);
          if (uVar3 < uVar8) {
            pmVar7 = v_00;
            uVar8 = uVar3;
          }
        }
      }
      uVar6 = local_78;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&k.components_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    if (pmVar7 == (vector *)0x0) {
      k.components_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      k.components_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      k.size_ = 0;
      k._4_4_ = 0;
      k.components_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      lsh::vector::vector(local_80,(vector<bool,_std::allocator<bool>_> *)&k);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                ((_Bvector_base<std::allocator<bool>_> *)&k);
    }
    else {
      lsh::vector::vector(local_80,pmVar7);
    }
    return pvVar2;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"Invalid vector size");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

vector table::query(const vector& v) const {
    if (this->dimensions_ != v.size()) {
      throw std::invalid_argument("Invalid vector size");
    }

    unsigned int n = this->partitions_.size();

    // Keep track of the best candidate we've encountered.
    const vector* best_c = nullptr;

    // Keep track of the distance to the best candidate.
    unsigned int best_d = UINT_MAX;

    for (unsigned int i = 0; i < n; i++) {
      vector k = this->masks_[i] & v;
      const partition& p = this->partitions_[i];

      auto it = p.find(k.hash());

      if (it == p.end()) {
        continue;
      }

      const bucket& b = p.at(k.hash());

      for (unsigned int u: b) {
        const vector& c = this->vectors_.at(u);

        unsigned int d = vector::distance(v, c);

        if (d < best_d) {
          best_c = &c;
          best_d = d;
        }
      }
    }

    return best_c ? *best_c : vector({});
  }